

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUploadCommand.cxx
# Opt level: O1

void __thiscall cmCTestUploadCommand::CheckArguments(cmCTestUploadCommand *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  long lVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  cmCTestUploadCommand *local_40;
  cmCTestUploadCommand *local_38;
  
  _Var3._M_current =
       (this->Files).
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->Files).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)pbVar1 - (long)_Var3._M_current >> 7;
  local_40 = this;
  local_38 = this;
  if (0 < lVar4) {
    lVar4 = lVar4 + 1;
    do {
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestUploadCommand::CheckArguments()::$_0>::operator()
                        ((_Iter_pred<cmCTestUploadCommand::CheckArguments()::__0> *)&local_40,_Var3)
      ;
      __first._M_current = _Var3._M_current;
      if (bVar2) goto LAB_001e40ea;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestUploadCommand::CheckArguments()::$_0>::operator()
                        ((_Iter_pred<cmCTestUploadCommand::CheckArguments()::__0> *)&local_40,
                         _Var3._M_current + 1);
      __first._M_current = _Var3._M_current + 1;
      if (bVar2) goto LAB_001e40ea;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestUploadCommand::CheckArguments()::$_0>::operator()
                        ((_Iter_pred<cmCTestUploadCommand::CheckArguments()::__0> *)&local_40,
                         _Var3._M_current + 2);
      __first._M_current = _Var3._M_current + 2;
      if (bVar2) goto LAB_001e40ea;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestUploadCommand::CheckArguments()::$_0>::operator()
                        ((_Iter_pred<cmCTestUploadCommand::CheckArguments()::__0> *)&local_40,
                         _Var3._M_current + 3);
      __first._M_current = _Var3._M_current + 3;
      if (bVar2) goto LAB_001e40ea;
      _Var3._M_current = _Var3._M_current + 4;
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  lVar4 = (long)pbVar1 - (long)_Var3._M_current >> 5;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      __first._M_current = pbVar1;
      if ((lVar4 != 3) ||
         (bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestUploadCommand::CheckArguments()::$_0>::
                  operator()((_Iter_pred<cmCTestUploadCommand::CheckArguments()::__0> *)&local_40,
                             _Var3), __first._M_current = _Var3._M_current, bVar2))
      goto LAB_001e40ea;
      _Var3._M_current = _Var3._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestUploadCommand::CheckArguments()::$_0>::operator()
                      ((_Iter_pred<cmCTestUploadCommand::CheckArguments()::__0> *)&local_40,_Var3);
    __first._M_current = _Var3._M_current;
    if (bVar2) goto LAB_001e40ea;
    _Var3._M_current = _Var3._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestUploadCommand::CheckArguments()::$_0>::operator()
                    ((_Iter_pred<cmCTestUploadCommand::CheckArguments()::__0> *)&local_40,_Var3);
  __first._M_current = _Var3._M_current;
  if (!bVar2) {
    __first._M_current = pbVar1;
  }
LAB_001e40ea:
  _Var3._M_current = __first._M_current + 1;
  if (_Var3._M_current != pbVar1 && __first._M_current != pbVar1) {
    do {
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestUploadCommand::CheckArguments()::$_0>::operator()
                        ((_Iter_pred<cmCTestUploadCommand::CheckArguments()::__0> *)&local_38,_Var3)
      ;
      if (!bVar2) {
        std::__cxx11::string::operator=((string *)__first._M_current,(string *)_Var3._M_current);
        __first._M_current = __first._M_current + 1;
      }
      _Var3._M_current = _Var3._M_current + 1;
    } while (_Var3._M_current != pbVar1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&(this->Files).
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ,(iterator)__first._M_current,
             (this->Files).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void cmCTestUploadCommand::CheckArguments()
{
  cm::erase_if(this->Files, [this](std::string const& arg) -> bool {
    if (!cmSystemTools::FileExists(arg)) {
      std::ostringstream e;
      e << "File \"" << arg << "\" does not exist. Cannot submit "
        << "a non-existent file.";
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return true;
    }
    return false;
  });
}